

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O3

void convolve_2d_sr_hor_2tap_avx2
               (uint8_t *src,int32_t src_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_q4)

{
  int32_t y;
  long lVar1;
  long lVar2;
  uint8_t *src_ptr;
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [16];
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  int16_t *im;
  
  auVar14 = _DAT_00561e40;
  auVar13 = _DAT_0050da40;
  if (w < 9) {
    auVar6 = vpsrlw_avx(ZEXT416(*(uint *)(filter_params_x->filter_ptr +
                                         (ulong)((subpel_x_q4 & 0xfU) * (uint)filter_params_x->taps)
                                         + 3)),1);
    auVar6 = vpshufb_avx(auVar6,_DAT_0050d5a0);
    lVar5 = (long)src_stride;
    lVar2 = (long)(src_stride * 2);
    if (w == 2) {
      lVar1 = 0;
      auVar13._8_2_ = 2;
      auVar13._0_8_ = 0x2000200020002;
      auVar13._10_2_ = 2;
      auVar13._12_2_ = 2;
      auVar13._14_2_ = 2;
      do {
        auVar14 = vpinsrd_avx(ZEXT416(*(uint *)src),*(undefined4 *)((long)src + lVar5),1);
        auVar14 = vpshufb_avx(auVar14,ZEXT816(0x605050402010100));
        auVar14 = vpmaddubsw_avx(auVar14,auVar6);
        auVar14 = vpaddw_avx(auVar14,auVar13);
        auVar14 = vpsraw_avx(auVar14,2);
        *(long *)(im + lVar1 * 2) = auVar14._0_8_;
        src = (uint8_t *)((long)src + lVar2);
        lVar1 = lVar1 + 2;
      } while (h != (int)lVar1);
    }
    else if (w == 4) {
      lVar1 = 0;
      auVar18._8_2_ = 2;
      auVar18._0_8_ = 0x2000200020002;
      auVar18._10_2_ = 2;
      auVar18._12_2_ = 2;
      auVar18._14_2_ = 2;
      do {
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *(ulong *)src;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)((long)src + lVar5);
        auVar13 = vpunpcklbw_avx(auVar12,auVar15);
        auVar13 = vpshufb_avx(auVar13,auVar14);
        auVar13 = vpmaddubsw_avx(auVar13,auVar6);
        auVar13 = vpaddw_avx(auVar13,auVar18);
        auVar13 = vpsraw_avx(auVar13,2);
        *(undefined1 (*) [16])(im + lVar1 * 4) = auVar13;
        src = (uint8_t *)((long)src + lVar2);
        lVar1 = lVar1 + 2;
      } while (h != (int)lVar1);
    }
    else {
      auVar14._8_2_ = 2;
      auVar14._0_8_ = 0x2000200020002;
      auVar14._10_2_ = 2;
      auVar14._12_2_ = 2;
      auVar14._14_2_ = 2;
      do {
        auVar18 = vpshufb_avx(*(undefined1 (*) [16])src,auVar13);
        auVar12 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar5),auVar13);
        auVar18 = vpmaddubsw_avx(auVar18,auVar6);
        auVar12 = vpmaddubsw_avx(auVar12,auVar6);
        auVar18 = vpaddw_avx(auVar18,auVar14);
        auVar15 = vpsraw_avx(auVar18,2);
        auVar18 = vpaddw_avx(auVar12,auVar14);
        auVar18 = vpsraw_avx(auVar18,2);
        *(undefined1 (*) [16])im = auVar15;
        *(undefined1 (*) [16])((long)im + 0x10) = auVar18;
        src = *(undefined1 (*) [16])src + lVar2;
        im = (int16_t *)((long)im + 0x20);
        h = h + -2;
      } while (h != 0);
    }
  }
  else {
    auVar13 = ZEXT416(*(uint *)(filter_params_x->filter_ptr +
                               (ulong)((subpel_x_q4 & 0xfU) * (uint)filter_params_x->taps) + 3));
    auVar7._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar13;
    auVar7._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
    auVar7 = vpsrlw_avx2(auVar7,1);
    auVar7 = vpshufb_avx2(auVar7,_DAT_00561e20);
    if (w == 0x10) {
      pauVar4 = (undefined1 (*) [16])(src + 1);
      auVar10._8_2_ = 2;
      auVar10._0_8_ = 0x2000200020002;
      auVar10._10_2_ = 2;
      auVar10._12_2_ = 2;
      auVar10._14_2_ = 2;
      auVar10._16_2_ = 2;
      auVar10._18_2_ = 2;
      auVar10._20_2_ = 2;
      auVar10._22_2_ = 2;
      auVar10._24_2_ = 2;
      auVar10._26_2_ = 2;
      auVar10._28_2_ = 2;
      auVar10._30_2_ = 2;
      do {
        auVar16._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(pauVar4[-1] + (long)src_stride + 0xf) +
             ZEXT116(1) * *(undefined1 (*) [16])(pauVar4[-1] + 0xf);
        auVar16._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(pauVar4[-1] + (long)src_stride + 0xf);
        auVar17._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar4 + src_stride) + ZEXT116(1) * *pauVar4;
        auVar17._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar4 + src_stride);
        auVar11 = vpunpcklbw_avx2(auVar16,auVar17);
        auVar16 = vpunpckhbw_avx2(auVar16,auVar17);
        auVar11 = vpmaddubsw_avx2(auVar11,auVar7);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar7);
        auVar11 = vpaddw_avx2(auVar11,auVar10);
        auVar16 = vpaddw_avx2(auVar16,auVar10);
        auVar19._0_16_ = ZEXT116(0) * auVar16._0_16_ + ZEXT116(1) * auVar11._0_16_;
        auVar19._16_16_ = ZEXT116(0) * auVar11._16_16_ + ZEXT116(1) * auVar16._0_16_;
        auVar17 = vpsraw_avx2(auVar19,2);
        auVar11 = vperm2i128_avx2(auVar11,auVar16,0x31);
        auVar11 = vpsraw_avx2(auVar11,2);
        *(undefined1 (*) [32])im = auVar17;
        *(undefined1 (*) [32])((long)im + 0x20) = auVar11;
        im = (int16_t *)((long)im + 0x40);
        pauVar4 = (undefined1 (*) [16])(*pauVar4 + src_stride * 2);
        h = h + -2;
      } while (h != 0);
    }
    else if (w == 0x20) {
      pauVar3 = (undefined1 (*) [32])(src + 1);
      auVar11._8_2_ = 2;
      auVar11._0_8_ = 0x2000200020002;
      auVar11._10_2_ = 2;
      auVar11._12_2_ = 2;
      auVar11._14_2_ = 2;
      auVar11._16_2_ = 2;
      auVar11._18_2_ = 2;
      auVar11._20_2_ = 2;
      auVar11._22_2_ = 2;
      auVar11._24_2_ = 2;
      auVar11._26_2_ = 2;
      auVar11._28_2_ = 2;
      auVar11._30_2_ = 2;
      do {
        auVar10 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar3[-1] + 0x1f),*pauVar3);
        auVar16 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar3[-1] + 0x1f),*pauVar3);
        auVar10 = vpmaddubsw_avx2(auVar10,auVar7);
        auVar16 = vpmaddubsw_avx2(auVar16,auVar7);
        auVar10 = vpaddw_avx2(auVar10,auVar11);
        auVar17 = vpsraw_avx2(auVar10,2);
        auVar10 = vpaddw_avx2(auVar16,auVar11);
        auVar10 = vpsraw_avx2(auVar10,2);
        *(undefined1 (*) [32])im = auVar17;
        *(undefined1 (*) [32])((long)im + 0x20) = auVar10;
        im = (int16_t *)((long)im + 0x40);
        pauVar3 = (undefined1 (*) [32])(*pauVar3 + src_stride);
        h = h + -1;
      } while (h != 0);
    }
    else if (w == 0x40) {
      pauVar3 = (undefined1 (*) [32])(src + 0x21);
      auVar8._8_2_ = 2;
      auVar8._0_8_ = 0x2000200020002;
      auVar8._10_2_ = 2;
      auVar8._12_2_ = 2;
      auVar8._14_2_ = 2;
      auVar8._16_2_ = 2;
      auVar8._18_2_ = 2;
      auVar8._20_2_ = 2;
      auVar8._22_2_ = 2;
      auVar8._24_2_ = 2;
      auVar8._26_2_ = 2;
      auVar8._28_2_ = 2;
      auVar8._30_2_ = 2;
      do {
        auVar10 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar3[-2] + 0x1f),pauVar3[-1]);
        auVar11 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar3[-2] + 0x1f),pauVar3[-1]);
        auVar10 = vpmaddubsw_avx2(auVar10,auVar7);
        auVar11 = vpmaddubsw_avx2(auVar11,auVar7);
        auVar10 = vpaddw_avx2(auVar10,auVar8);
        auVar16 = vpsraw_avx2(auVar10,2);
        auVar10 = vpaddw_avx2(auVar11,auVar8);
        auVar10 = vpsraw_avx2(auVar10,2);
        *(undefined1 (*) [32])im = auVar16;
        *(undefined1 (*) [32])((long)im + 0x20) = auVar10;
        auVar10 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar3[-1] + 0x1f),*pauVar3);
        auVar11 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar3[-1] + 0x1f),*pauVar3);
        auVar10 = vpmaddubsw_avx2(auVar10,auVar7);
        auVar11 = vpmaddubsw_avx2(auVar11,auVar7);
        auVar10 = vpaddw_avx2(auVar10,auVar8);
        auVar16 = vpsraw_avx2(auVar10,2);
        auVar10 = vpaddw_avx2(auVar11,auVar8);
        auVar10 = vpsraw_avx2(auVar10,2);
        *(undefined1 (*) [32])((long)im + 0x40) = auVar16;
        *(undefined1 (*) [32])((long)im + 0x60) = auVar10;
        im = (int16_t *)((long)im + 0x80);
        pauVar3 = (undefined1 (*) [32])(*pauVar3 + src_stride);
        h = h + -1;
      } while (h != 0);
    }
    else {
      pauVar3 = (undefined1 (*) [32])(src + 0x61);
      auVar9._8_2_ = 2;
      auVar9._0_8_ = 0x2000200020002;
      auVar9._10_2_ = 2;
      auVar9._12_2_ = 2;
      auVar9._14_2_ = 2;
      auVar9._16_2_ = 2;
      auVar9._18_2_ = 2;
      auVar9._20_2_ = 2;
      auVar9._22_2_ = 2;
      auVar9._24_2_ = 2;
      auVar9._26_2_ = 2;
      auVar9._28_2_ = 2;
      auVar9._30_2_ = 2;
      do {
        auVar10 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar3[-4] + 0x1f),pauVar3[-3]);
        auVar11 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar3[-4] + 0x1f),pauVar3[-3]);
        auVar10 = vpmaddubsw_avx2(auVar10,auVar7);
        auVar11 = vpmaddubsw_avx2(auVar11,auVar7);
        auVar10 = vpaddw_avx2(auVar10,auVar9);
        auVar16 = vpsraw_avx2(auVar10,2);
        auVar10 = vpaddw_avx2(auVar11,auVar9);
        auVar10 = vpsraw_avx2(auVar10,2);
        *(undefined1 (*) [32])im = auVar16;
        *(undefined1 (*) [32])((long)im + 0x20) = auVar10;
        auVar10 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar3[-3] + 0x1f),pauVar3[-2]);
        auVar11 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar3[-3] + 0x1f),pauVar3[-2]);
        auVar10 = vpmaddubsw_avx2(auVar10,auVar7);
        auVar11 = vpmaddubsw_avx2(auVar11,auVar7);
        auVar10 = vpaddw_avx2(auVar10,auVar9);
        auVar16 = vpsraw_avx2(auVar10,2);
        auVar10 = vpaddw_avx2(auVar11,auVar9);
        auVar10 = vpsraw_avx2(auVar10,2);
        *(undefined1 (*) [32])((long)im + 0x40) = auVar16;
        *(undefined1 (*) [32])((long)im + 0x60) = auVar10;
        auVar10 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar3[-2] + 0x1f),pauVar3[-1]);
        auVar11 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar3[-2] + 0x1f),pauVar3[-1]);
        auVar10 = vpmaddubsw_avx2(auVar10,auVar7);
        auVar11 = vpmaddubsw_avx2(auVar11,auVar7);
        auVar10 = vpaddw_avx2(auVar10,auVar9);
        auVar16 = vpsraw_avx2(auVar10,2);
        auVar10 = vpaddw_avx2(auVar11,auVar9);
        auVar10 = vpsraw_avx2(auVar10,2);
        *(undefined1 (*) [32])((long)im + 0x80) = auVar16;
        *(undefined1 (*) [32])((long)im + 0xa0) = auVar10;
        auVar10 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar3[-1] + 0x1f),*pauVar3);
        auVar11 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar3[-1] + 0x1f),*pauVar3);
        auVar10 = vpmaddubsw_avx2(auVar10,auVar7);
        auVar11 = vpmaddubsw_avx2(auVar11,auVar7);
        auVar10 = vpaddw_avx2(auVar10,auVar9);
        auVar16 = vpsraw_avx2(auVar10,2);
        auVar10 = vpaddw_avx2(auVar11,auVar9);
        auVar10 = vpsraw_avx2(auVar10,2);
        *(undefined1 (*) [32])((long)im + 0xc0) = auVar16;
        *(undefined1 (*) [32])((long)im + 0xe0) = auVar10;
        im = (int16_t *)((long)im + 0x100);
        pauVar3 = (undefined1 (*) [32])(*pauVar3 + src_stride);
        h = h + -1;
      } while (h != 0);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_hor_2tap_avx2(
    const uint8_t *const src, const int32_t src_stride, const int32_t w,
    const int32_t h, const InterpFilterParams *const filter_params_x,
    const int32_t subpel_x_q4, int16_t *const im_block) {
  const uint8_t *src_ptr = src;
  int32_t y = h;
  int16_t *im = im_block;

  if (w <= 8) {
    __m128i coeffs_128;

    prepare_half_coeffs_2tap_ssse3(filter_params_x, subpel_x_q4, &coeffs_128);

    if (w == 2) {
      do {
        const __m128i r =
            x_convolve_2tap_2x2_sse4_1(src_ptr, src_stride, &coeffs_128);
        xy_x_round_store_2x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 2;
        y -= 2;
      } while (y);
    } else if (w == 4) {
      do {
        const __m128i r =
            x_convolve_2tap_4x2_ssse3(src_ptr, src_stride, &coeffs_128);
        xy_x_round_store_4x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 4;
        y -= 2;
      } while (y);
    } else {
      assert(w == 8);

      do {
        __m128i r[2];

        x_convolve_2tap_8x2_ssse3(src_ptr, src_stride, &coeffs_128, r);
        xy_x_round_store_8x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 8;
        y -= 2;
      } while (y);
    }
  } else {
    __m256i coeffs_256;

    prepare_half_coeffs_2tap_avx2(filter_params_x, subpel_x_q4, &coeffs_256);

    if (w == 16) {
      do {
        __m256i r[2];

        x_convolve_2tap_16x2_avx2(src_ptr, src_stride, &coeffs_256, r);
        xy_x_round_store_32_avx2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 16;
        y -= 2;
      } while (y);
    } else if (w == 32) {
      do {
        xy_x_2tap_32_avx2(src_ptr, &coeffs_256, im);
        src_ptr += src_stride;
        im += 32;
      } while (--y);
    } else if (w == 64) {
      do {
        xy_x_2tap_32_avx2(src_ptr + 0 * 32, &coeffs_256, im + 0 * 32);
        xy_x_2tap_32_avx2(src_ptr + 1 * 32, &coeffs_256, im + 1 * 32);
        src_ptr += src_stride;
        im += 64;
      } while (--y);
    } else {
      assert(w == 128);

      do {
        xy_x_2tap_32_avx2(src_ptr + 0 * 32, &coeffs_256, im + 0 * 32);
        xy_x_2tap_32_avx2(src_ptr + 1 * 32, &coeffs_256, im + 1 * 32);
        xy_x_2tap_32_avx2(src_ptr + 2 * 32, &coeffs_256, im + 2 * 32);
        xy_x_2tap_32_avx2(src_ptr + 3 * 32, &coeffs_256, im + 3 * 32);
        src_ptr += src_stride;
        im += 128;
      } while (--y);
    }
  }
}